

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# descriptor.cc
# Opt level: O3

void __thiscall
google::protobuf::DescriptorBuilder::BuildFieldOrExtension
          (DescriptorBuilder *this,FieldDescriptorProto *proto,Descriptor *parent,
          FieldDescriptor *result,bool is_extension)

{
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  pointer pcVar2;
  Tables *pTVar3;
  double dVar4;
  Symbol symbol;
  int iVar5;
  uint uVar6;
  undefined4 uVar7;
  Descriptor *pDVar8;
  string *psVar9;
  string *psVar10;
  size_t sVar11;
  long lVar12;
  OptionsType *orig_options;
  FieldDescriptor FVar14;
  size_type sVar15;
  ulong uVar16;
  FieldDescriptor *pFVar17;
  anon_union_8_7_bfa3a334_for_Symbol_2 aVar18;
  string result_1;
  string local_228;
  string lowercase_name;
  char *end_pos;
  int local_1d8;
  char local_1d4 [36];
  SubstituteArg local_1b0;
  SubstituteArg local_180;
  SubstituteArg local_150;
  SubstituteArg local_120;
  SubstituteArg local_f0;
  SubstituteArg local_c0;
  SubstituteArg local_90;
  SubstituteArg local_60;
  ulong uVar13;
  
  pDVar8 = parent;
  if (parent == (Descriptor *)0x0) {
    pDVar8 = (Descriptor *)this->file_;
  }
  psVar9 = DescriptorPool::Tables::AllocateString(this->tables_,*(string **)(pDVar8 + 8));
  if (psVar9->_M_string_length != 0) {
    std::__cxx11::string::_M_replace_aux((ulong)psVar9,psVar9->_M_string_length,0,'\x01');
  }
  std::__cxx11::string::_M_append((char *)psVar9,(ulong)(proto->name_->_M_dataplus)._M_p);
  ValidateSymbolName(this,proto->name_,psVar9,&proto->super_Message);
  psVar10 = DescriptorPool::Tables::AllocateString(this->tables_,proto->name_);
  *(string **)result = psVar10;
  *(string **)(result + 8) = psVar9;
  *(FileDescriptor **)(result + 0x20) = this->file_;
  *(int32 *)(result + 0x28) = proto->number_;
  result[0x34] = (FieldDescriptor)is_extension;
  lowercase_name._M_dataplus._M_p = (pointer)&lowercase_name.field_2;
  pcVar2 = (proto->name_->_M_dataplus)._M_p;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&lowercase_name,pcVar2,pcVar2 + proto->name_->_M_string_length);
  if (lowercase_name._M_string_length == 0) {
    psVar9 = proto->name_;
    if (psVar9->_M_string_length != 0) goto LAB_001d5390;
LAB_001d537c:
    *(undefined8 *)(result + 0x10) = *(undefined8 *)result;
  }
  else {
    sVar15 = 0;
    do {
      if ((byte)(lowercase_name._M_dataplus._M_p[sVar15] + 0xbfU) < 0x1a) {
        lowercase_name._M_dataplus._M_p[sVar15] = lowercase_name._M_dataplus._M_p[sVar15] | 0x20;
      }
      sVar15 = sVar15 + 1;
    } while (lowercase_name._M_string_length != sVar15);
    psVar9 = proto->name_;
    if ((lowercase_name._M_string_length == psVar9->_M_string_length) &&
       ((lowercase_name._M_string_length == 0 ||
        (iVar5 = bcmp(lowercase_name._M_dataplus._M_p,(psVar9->_M_dataplus)._M_p,
                      lowercase_name._M_string_length), iVar5 == 0)))) goto LAB_001d537c;
LAB_001d5390:
    psVar9 = DescriptorPool::Tables::AllocateString(this->tables_,&lowercase_name);
    *(string **)(result + 0x10) = psVar9;
    psVar9 = proto->name_;
  }
  pTVar3 = this->tables_;
  result_1._M_dataplus._M_p = (pointer)&result_1.field_2;
  result_1._M_string_length = 0;
  result_1.field_2._M_local_buf[0] = '\0';
  std::__cxx11::string::reserve((ulong)&result_1);
  uVar13 = psVar9->_M_string_length;
  if (uVar13 != 0) {
    uVar16 = 0;
    do {
      if ((psVar9->_M_dataplus)._M_p[uVar16] != '_') {
        std::__cxx11::string::push_back((char)&result_1);
        uVar13 = psVar9->_M_string_length;
      }
      uVar16 = uVar16 + 1;
    } while (uVar16 < uVar13);
  }
  if ((result_1._M_string_length != 0) && ((byte)(*result_1._M_dataplus._M_p + 0xbfU) < 0x1a)) {
    *result_1._M_dataplus._M_p = *result_1._M_dataplus._M_p | 0x20;
  }
  paVar1 = &result_1.field_2;
  aVar18.descriptor = (Descriptor *)0x1d5457;
  psVar9 = DescriptorPool::Tables::AllocateString(pTVar3,&result_1);
  *(string **)(result + 0x18) = psVar9;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)result_1._M_dataplus._M_p != paVar1) {
    aVar18.descriptor = (Descriptor *)0x1d547b;
    operator_delete(result_1._M_dataplus._M_p,
                    CONCAT71(result_1.field_2._M_allocated_capacity._1_7_,
                             result_1.field_2._M_local_buf[0]) + 1);
  }
  *(int *)(result + 0x2c) = proto->type_;
  iVar5 = proto->label_;
  *(int *)(result + 0x30) = iVar5;
  *(undefined8 *)(result + 0x38) = 0;
  *(undefined8 *)(result + 0x40) = 0;
  *(undefined8 *)(result + 0x48) = 0;
  *(undefined8 *)(result + 0x50) = 0;
  *(undefined8 *)(result + 0x58) = 0;
  uVar6 = proto->_has_bits_[0];
  FVar14 = SUB41((uVar6 & 0x40) >> 6,0);
  result[0x68] = FVar14;
  if ((iVar5 == 3 & (byte)FVar14) == 1) {
    psVar9 = *(string **)(result + 8);
    result_1._M_dataplus._M_p = (pointer)paVar1;
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)&result_1,"Repeated fields can\'t have default values.","");
    aVar18.descriptor = (Descriptor *)0x1d54f0;
    AddError(this,psVar9,&proto->super_Message,DEFAULT_VALUE,&result_1);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)result_1._M_dataplus._M_p != paVar1) {
      aVar18.descriptor = (Descriptor *)0x1d5506;
      operator_delete(result_1._M_dataplus._M_p,
                      CONCAT71(result_1.field_2._M_allocated_capacity._1_7_,
                               result_1.field_2._M_local_buf[0]) + 1);
    }
    uVar6 = proto->_has_bits_[0];
  }
  if ((uVar6 & 8) == 0) goto switchD_001d56bb_default;
  if ((uVar6 & 0x40) == 0) {
    switch(*(undefined4 *)(FieldDescriptor::kTypeToCppTypeMap + (ulong)*(uint *)(result + 0x2c) * 4)
          ) {
    case 1:
    case 3:
    case 6:
      *(undefined4 *)(result + 0x70) = 0;
      break;
    case 2:
    case 4:
    case 5:
    case 8:
      *(undefined8 *)(result + 0x70) = 0;
      break;
    case 7:
      result[0x70] = (FieldDescriptor)0x0;
      break;
    case 9:
      *(undefined1 **)(result + 0x70) = (anonymous_namespace)::kEmptyString_abi_cxx11_;
    }
    goto switchD_001d56bb_default;
  }
  end_pos = (char *)0x0;
  switch(*(undefined4 *)(FieldDescriptor::kTypeToCppTypeMap + (ulong)*(uint *)(result + 0x2c) * 4))
  {
  case 1:
    aVar18.descriptor = (Descriptor *)0x1d59bd;
    lVar12 = strtol((proto->default_value_->_M_dataplus)._M_p,&end_pos,0);
    uVar7 = (undefined4)lVar12;
    goto LAB_001d5ab5;
  case 2:
    aVar18.descriptor = (Descriptor *)0x1d5afb;
    psVar9 = (string *)strtoll((proto->default_value_->_M_dataplus)._M_p,&end_pos,0);
    goto LAB_001d5c59;
  case 3:
    aVar18.descriptor = (Descriptor *)0x1d5ab5;
    uVar13 = strtoul((proto->default_value_->_M_dataplus)._M_p,&end_pos,0);
    uVar7 = (undefined4)uVar13;
LAB_001d5ab5:
    *(undefined4 *)(result + 0x70) = uVar7;
    break;
  case 4:
    aVar18.descriptor = (Descriptor *)0x1d5ad3;
    psVar9 = (string *)strtoull((proto->default_value_->_M_dataplus)._M_p,&end_pos,0);
    goto LAB_001d5c59;
  case 5:
    aVar18.descriptor = (Descriptor *)0x1d59f7;
    iVar5 = std::__cxx11::string::compare((char *)proto->default_value_);
    if (iVar5 == 0) {
      psVar9 = (string *)0x7ff0000000000000;
    }
    else {
      aVar18.descriptor = (Descriptor *)0x1d5a0f;
      iVar5 = std::__cxx11::string::compare((char *)proto->default_value_);
      if (iVar5 == 0) {
        psVar9 = (string *)0xfff0000000000000;
      }
      else {
        aVar18.descriptor = (Descriptor *)0x1d5a27;
        iVar5 = std::__cxx11::string::compare((char *)proto->default_value_);
        if (iVar5 != 0) {
          aVar18.descriptor = (Descriptor *)0x1d5a43;
          dVar4 = NoLocaleStrtod((proto->default_value_->_M_dataplus)._M_p,&end_pos);
          *(double *)(result + 0x70) = dVar4;
          break;
        }
        psVar9 = (string *)0x7ff8000000000000;
      }
    }
LAB_001d5c59:
    *(string **)(result + 0x70) = psVar9;
    break;
  case 6:
    aVar18.descriptor = (Descriptor *)0x1d5b10;
    iVar5 = std::__cxx11::string::compare((char *)proto->default_value_);
    if (iVar5 == 0) {
      *(undefined4 *)(result + 0x70) = 0x7f800000;
    }
    else {
      aVar18.descriptor = (Descriptor *)0x1d5b28;
      iVar5 = std::__cxx11::string::compare((char *)proto->default_value_);
      if (iVar5 == 0) {
        *(undefined4 *)(result + 0x70) = 0xff800000;
      }
      else {
        aVar18.descriptor = (Descriptor *)0x1d5b40;
        iVar5 = std::__cxx11::string::compare((char *)proto->default_value_);
        if (iVar5 == 0) {
          *(undefined4 *)(result + 0x70) = 0x7fc00000;
        }
        else {
          aVar18.descriptor = (Descriptor *)0x1d5b5c;
          dVar4 = NoLocaleStrtod((proto->default_value_->_M_dataplus)._M_p,&end_pos);
          *(float *)(result + 0x70) = (float)dVar4;
        }
      }
    }
    break;
  case 7:
    aVar18.descriptor = (Descriptor *)0x1d5b7a;
    iVar5 = std::__cxx11::string::compare((char *)proto->default_value_);
    if (iVar5 == 0) {
      result[0x70] = (FieldDescriptor)0x1;
    }
    else {
      aVar18.descriptor = (Descriptor *)0x1d5b92;
      iVar5 = std::__cxx11::string::compare((char *)proto->default_value_);
      if (iVar5 != 0) {
        psVar9 = *(string **)(result + 8);
        result_1._M_dataplus._M_p = (pointer)paVar1;
        std::__cxx11::string::_M_construct<char_const*>
                  ((string *)&result_1,"Boolean default must be true or false.","");
        aVar18.descriptor = (Descriptor *)0x1d5bcd;
        AddError(this,psVar9,&proto->super_Message,DEFAULT_VALUE,&result_1);
        goto LAB_001d5bf3;
      }
      result[0x70] = (FieldDescriptor)0x0;
    }
    break;
  case 8:
    *(undefined8 *)(result + 0x70) = 0;
    break;
  case 9:
    pTVar3 = this->tables_;
    if (*(uint *)(result + 0x2c) != 0xc) {
      aVar18.descriptor = (Descriptor *)0x1d5c17;
      psVar9 = DescriptorPool::Tables::AllocateString(pTVar3,proto->default_value_);
      goto LAB_001d5c59;
    }
    UnescapeCEscapeString(&result_1,proto->default_value_);
    aVar18.descriptor = (Descriptor *)0x1d5bef;
    psVar9 = DescriptorPool::Tables::AllocateString(pTVar3,&result_1);
    *(string **)(result + 0x70) = psVar9;
LAB_001d5bf3:
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)result_1._M_dataplus._M_p != paVar1) {
      aVar18.descriptor = (Descriptor *)0x1d5c09;
      operator_delete(result_1._M_dataplus._M_p,
                      CONCAT71(result_1.field_2._M_allocated_capacity._1_7_,
                               result_1.field_2._M_local_buf[0]) + 1);
    }
    break;
  case 10:
    psVar9 = *(string **)(result + 8);
    result_1._M_dataplus._M_p = (pointer)paVar1;
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)&result_1,"Messages can\'t have default values.","");
    aVar18.descriptor = (Descriptor *)0x1d5a80;
    AddError(this,psVar9,&proto->super_Message,DEFAULT_VALUE,&result_1);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)result_1._M_dataplus._M_p != paVar1) {
      aVar18.descriptor = (Descriptor *)0x1d5a96;
      operator_delete(result_1._M_dataplus._M_p,
                      CONCAT71(result_1.field_2._M_allocated_capacity._1_7_,
                               result_1.field_2._M_local_buf[0]) + 1);
    }
    result[0x68] = (FieldDescriptor)0x0;
    break;
  default:
    goto switchD_001d56bb_default;
  }
  if ((end_pos != (char *)0x0) &&
     ((proto->default_value_->_M_string_length == 0 || (*end_pos != '\0')))) {
    psVar9 = *(string **)(result + 8);
    result_1._M_dataplus._M_p = (pointer)paVar1;
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)&result_1,"Couldn\'t parse default value.","");
    aVar18.descriptor = (Descriptor *)0x1d5cb5;
    AddError(this,psVar9,&proto->super_Message,DEFAULT_VALUE,&result_1);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)result_1._M_dataplus._M_p != paVar1) {
      aVar18.descriptor = (Descriptor *)0x1d5ccf;
      operator_delete(result_1._M_dataplus._M_p,
                      CONCAT71(result_1.field_2._M_allocated_capacity._1_7_,
                               result_1.field_2._M_local_buf[0]) + 1);
    }
  }
switchD_001d56bb_default:
  uVar6 = *(uint *)(result + 0x28);
  if ((int)uVar6 < 1) {
    psVar9 = *(string **)(result + 8);
    result_1._M_dataplus._M_p = (pointer)paVar1;
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)&result_1,"Field numbers must be positive integers.","");
    aVar18.descriptor = (Descriptor *)0x1d56fd;
    AddError(this,psVar9,&proto->super_Message,NUMBER,&result_1);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)result_1._M_dataplus._M_p != paVar1) {
      aVar18.descriptor = (Descriptor *)0x1d5713;
      operator_delete(result_1._M_dataplus._M_p,
                      CONCAT71(result_1.field_2._M_allocated_capacity._1_7_,
                               result_1.field_2._M_local_buf[0]) + 1);
    }
LAB_001d5718:
    uVar6 = proto->_has_bits_[0];
    if (!is_extension) goto LAB_001d588a;
    pFVar17 = result + 0x40;
    if ((uVar6 & 0x20) != 0) goto LAB_001d58e5;
    psVar9 = *(string **)(result + 8);
    result_1._M_dataplus._M_p = (pointer)&result_1.field_2;
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)&result_1,"FieldDescriptorProto.extendee not set for extension field.","");
    aVar18.descriptor = (Descriptor *)0x1d5769;
    AddError(this,psVar9,&proto->super_Message,EXTENDEE,&result_1);
  }
  else {
    if (uVar6 < 0x20000000 || is_extension) {
      if (uVar6 - 19000 < 1000) {
        psVar9 = *(string **)(result + 8);
        result_1._M_dataplus._M_p =
             FastInt32ToBuffer(19000,(char *)((long)&result_1._M_string_length + 4));
        sVar11 = strlen(result_1._M_dataplus._M_p);
        result_1._M_string_length = CONCAT44(result_1._M_string_length._4_4_,(int)sVar11);
        end_pos = FastInt32ToBuffer(19999,local_1d4);
        sVar11 = strlen(end_pos);
        local_1d8 = (int)sVar11;
        local_60.text_ = (char *)0x0;
        local_60.size_ = -1;
        local_90.text_ = (char *)0x0;
        local_90.size_ = -1;
        local_c0.text_ = (char *)0x0;
        local_c0.size_ = -1;
        local_f0.text_ = (char *)0x0;
        local_f0.size_ = -1;
        local_120.text_ = (char *)0x0;
        local_120.size_ = -1;
        local_150.text_ = (char *)0x0;
        local_150.size_ = -1;
        local_180.text_ = (char *)0x0;
        local_180.size_ = -1;
        local_1b0.text_ = (char *)0x0;
        local_1b0.size_ = -1;
        strings::Substitute_abi_cxx11_
                  (&local_228,
                   (strings *)
                   "Field numbers $0 through $1 are reserved for the protocol buffer library implementation."
                   ,(char *)&result_1,(SubstituteArg *)&end_pos,&local_60,&local_90,&local_c0,
                   &local_f0,&local_120,&local_150,&local_180,&local_1b0,
                   (SubstituteArg *)result_1._M_dataplus._M_p);
        aVar18.descriptor = (Descriptor *)0x1d5664;
        AddError(this,psVar9,&proto->super_Message,NUMBER,&local_228);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_228._M_dataplus._M_p != &local_228.field_2) {
          aVar18.descriptor = (Descriptor *)0x1d5688;
          operator_delete(local_228._M_dataplus._M_p,local_228.field_2._M_allocated_capacity + 1);
        }
      }
      goto LAB_001d5718;
    }
    psVar9 = *(string **)(result + 8);
    result_1._M_dataplus._M_p =
         FastInt32ToBuffer(0x1fffffff,(char *)((long)&result_1._M_string_length + 4));
    sVar11 = strlen(result_1._M_dataplus._M_p);
    result_1._M_string_length = CONCAT44(result_1._M_string_length._4_4_,(int)sVar11);
    end_pos = (char *)0x0;
    local_1d8 = -1;
    local_60.text_ = (char *)0x0;
    local_60.size_ = -1;
    local_90.text_ = (char *)0x0;
    local_90.size_ = -1;
    local_c0.text_ = (char *)0x0;
    local_c0.size_ = -1;
    local_f0.text_ = (char *)0x0;
    local_f0.size_ = -1;
    local_120.text_ = (char *)0x0;
    local_120.size_ = -1;
    local_150.text_ = (char *)0x0;
    local_150.size_ = -1;
    local_180.text_ = (char *)0x0;
    local_180.size_ = -1;
    local_1b0.text_ = (char *)0x0;
    local_1b0.size_ = -1;
    strings::Substitute_abi_cxx11_
              (&local_228,(strings *)"Field numbers cannot be greater than $0.",(char *)&result_1,
               (SubstituteArg *)&end_pos,&local_60,&local_90,&local_c0,&local_f0,&local_120,
               &local_150,&local_180,&local_1b0,(SubstituteArg *)result_1._M_dataplus._M_p);
    aVar18.descriptor = (Descriptor *)0x1d5866;
    AddError(this,psVar9,&proto->super_Message,NUMBER,&local_228);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_228._M_dataplus._M_p != &local_228.field_2) {
      aVar18.descriptor = (Descriptor *)0x1d5886;
      operator_delete(local_228._M_dataplus._M_p,local_228.field_2._M_allocated_capacity + 1);
    }
    uVar6 = proto->_has_bits_[0];
LAB_001d588a:
    pFVar17 = result + 0x38;
    if ((uVar6 & 0x20) == 0) goto LAB_001d58e5;
    psVar9 = *(string **)(result + 8);
    result_1._M_dataplus._M_p = (pointer)&result_1.field_2;
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)&result_1,"FieldDescriptorProto.extendee set for non-extension field.","");
    aVar18.descriptor = (Descriptor *)0x1d58ca;
    AddError(this,psVar9,&proto->super_Message,EXTENDEE,&result_1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)result_1._M_dataplus._M_p != &result_1.field_2) {
    aVar18.descriptor = (Descriptor *)0x1d58e5;
    operator_delete(result_1._M_dataplus._M_p,
                    CONCAT71(result_1.field_2._M_allocated_capacity._1_7_,
                             result_1.field_2._M_local_buf[0]) + 1);
  }
LAB_001d58e5:
  *(Descriptor **)pFVar17 = parent;
  if ((proto->_has_bits_[0] & 0x80) == 0) {
    *(undefined8 *)(result + 0x60) = 0;
  }
  else {
    orig_options = proto->options_;
    if (orig_options == (OptionsType *)0x0) {
      orig_options = *(OptionsType **)(FieldDescriptorProto::default_instance_ + 0x38);
    }
    aVar18.descriptor = (Descriptor *)0x1d5922;
    AllocateOptionsImpl<google::protobuf::FieldDescriptor>
              (this,*(string **)(result + 8),*(string **)(result + 8),orig_options,result);
  }
  symbol.field_1.descriptor = aVar18.descriptor;
  symbol._0_8_ = result;
  AddSymbol(this,*(string **)(result + 8),parent,*(string **)result,&proto->super_Message,symbol);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)lowercase_name._M_dataplus._M_p != &lowercase_name.field_2) {
    operator_delete(lowercase_name._M_dataplus._M_p,lowercase_name.field_2._M_allocated_capacity + 1
                   );
  }
  return;
}

Assistant:

void DescriptorBuilder::BuildFieldOrExtension(const FieldDescriptorProto& proto,
                                              const Descriptor* parent,
                                              FieldDescriptor* result,
                                              bool is_extension) {
  const string& scope = (parent == NULL) ?
    file_->package() : parent->full_name();
  string* full_name = tables_->AllocateString(scope);
  if (!full_name->empty()) full_name->append(1, '.');
  full_name->append(proto.name());

  ValidateSymbolName(proto.name(), *full_name, proto);

  result->name_         = tables_->AllocateString(proto.name());
  result->full_name_    = full_name;
  result->file_         = file_;
  result->number_       = proto.number();
  result->is_extension_ = is_extension;

  // If .proto files follow the style guide then the name should already be
  // lower-cased.  If that's the case we can just reuse the string we already
  // allocated rather than allocate a new one.
  string lowercase_name(proto.name());
  LowerString(&lowercase_name);
  if (lowercase_name == proto.name()) {
    result->lowercase_name_ = result->name_;
  } else {
    result->lowercase_name_ = tables_->AllocateString(lowercase_name);
  }

  // Don't bother with the above optimization for camel-case names since
  // .proto files that follow the guide shouldn't be using names in this
  // format, so the optimization wouldn't help much.
  result->camelcase_name_ = tables_->AllocateString(ToCamelCase(proto.name()));

  // Some compilers do not allow static_cast directly between two enum types,
  // so we must cast to int first.
  result->type_  = static_cast<FieldDescriptor::Type>(
                     implicit_cast<int>(proto.type()));
  result->label_ = static_cast<FieldDescriptor::Label>(
                     implicit_cast<int>(proto.label()));

  // Some of these may be filled in when cross-linking.
  result->containing_type_ = NULL;
  result->extension_scope_ = NULL;
  result->experimental_map_key_ = NULL;
  result->message_type_ = NULL;
  result->enum_type_ = NULL;

  result->has_default_value_ = proto.has_default_value();
  if (proto.has_default_value() && result->is_repeated()) {
    AddError(result->full_name(), proto,
             DescriptorPool::ErrorCollector::DEFAULT_VALUE,
             "Repeated fields can't have default values.");
  }

  if (proto.has_type()) {
    if (proto.has_default_value()) {
      char* end_pos = NULL;
      switch (result->cpp_type()) {
        case FieldDescriptor::CPPTYPE_INT32:
          result->default_value_int32_ =
            strtol(proto.default_value().c_str(), &end_pos, 0);
          break;
        case FieldDescriptor::CPPTYPE_INT64:
          result->default_value_int64_ =
            strto64(proto.default_value().c_str(), &end_pos, 0);
          break;
        case FieldDescriptor::CPPTYPE_UINT32:
          result->default_value_uint32_ =
            strtoul(proto.default_value().c_str(), &end_pos, 0);
          break;
        case FieldDescriptor::CPPTYPE_UINT64:
          result->default_value_uint64_ =
            strtou64(proto.default_value().c_str(), &end_pos, 0);
          break;
        case FieldDescriptor::CPPTYPE_FLOAT:
          if (proto.default_value() == "inf") {
            result->default_value_float_ = numeric_limits<float>::infinity();
          } else if (proto.default_value() == "-inf") {
            result->default_value_float_ = -numeric_limits<float>::infinity();
          } else if (proto.default_value() == "nan") {
            result->default_value_float_ = numeric_limits<float>::quiet_NaN();
          } else  {
            result->default_value_float_ =
              NoLocaleStrtod(proto.default_value().c_str(), &end_pos);
          }
          break;
        case FieldDescriptor::CPPTYPE_DOUBLE:
          if (proto.default_value() == "inf") {
            result->default_value_double_ = numeric_limits<double>::infinity();
          } else if (proto.default_value() == "-inf") {
            result->default_value_double_ = -numeric_limits<double>::infinity();
          } else if (proto.default_value() == "nan") {
            result->default_value_double_ = numeric_limits<double>::quiet_NaN();
          } else  {
            result->default_value_double_ =
              NoLocaleStrtod(proto.default_value().c_str(), &end_pos);
          }
          break;
        case FieldDescriptor::CPPTYPE_BOOL:
          if (proto.default_value() == "true") {
            result->default_value_bool_ = true;
          } else if (proto.default_value() == "false") {
            result->default_value_bool_ = false;
          } else {
            AddError(result->full_name(), proto,
                     DescriptorPool::ErrorCollector::DEFAULT_VALUE,
                     "Boolean default must be true or false.");
          }
          break;
        case FieldDescriptor::CPPTYPE_ENUM:
          // This will be filled in when cross-linking.
          result->default_value_enum_ = NULL;
          break;
        case FieldDescriptor::CPPTYPE_STRING:
          if (result->type() == FieldDescriptor::TYPE_BYTES) {
            result->default_value_string_ = tables_->AllocateString(
              UnescapeCEscapeString(proto.default_value()));
          } else {
            result->default_value_string_ =
                tables_->AllocateString(proto.default_value());
          }
          break;
        case FieldDescriptor::CPPTYPE_MESSAGE:
          AddError(result->full_name(), proto,
                   DescriptorPool::ErrorCollector::DEFAULT_VALUE,
                   "Messages can't have default values.");
          result->has_default_value_ = false;
          break;
      }

      if (end_pos != NULL) {
        // end_pos is only set non-NULL by the parsers for numeric types, above.
        // This checks that the default was non-empty and had no extra junk
        // after the end of the number.
        if (proto.default_value().empty() || *end_pos != '\0') {
          AddError(result->full_name(), proto,
                   DescriptorPool::ErrorCollector::DEFAULT_VALUE,
                   "Couldn't parse default value.");
        }
      }
    } else {
      // No explicit default value
      switch (result->cpp_type()) {
        case FieldDescriptor::CPPTYPE_INT32:
          result->default_value_int32_ = 0;
          break;
        case FieldDescriptor::CPPTYPE_INT64:
          result->default_value_int64_ = 0;
          break;
        case FieldDescriptor::CPPTYPE_UINT32:
          result->default_value_uint32_ = 0;
          break;
        case FieldDescriptor::CPPTYPE_UINT64:
          result->default_value_uint64_ = 0;
          break;
        case FieldDescriptor::CPPTYPE_FLOAT:
          result->default_value_float_ = 0.0f;
          break;
        case FieldDescriptor::CPPTYPE_DOUBLE:
          result->default_value_double_ = 0.0;
          break;
        case FieldDescriptor::CPPTYPE_BOOL:
          result->default_value_bool_ = false;
          break;
        case FieldDescriptor::CPPTYPE_ENUM:
          // This will be filled in when cross-linking.
          result->default_value_enum_ = NULL;
          break;
        case FieldDescriptor::CPPTYPE_STRING:
          result->default_value_string_ = &kEmptyString;
          break;
        case FieldDescriptor::CPPTYPE_MESSAGE:
          break;
      }
    }
  }

  if (result->number() <= 0) {
    AddError(result->full_name(), proto, DescriptorPool::ErrorCollector::NUMBER,
             "Field numbers must be positive integers.");
  } else if (!is_extension && result->number() > FieldDescriptor::kMaxNumber) {
    // Only validate that the number is within the valid field range if it is
    // not an extension. Since extension numbers are validated with the
    // extendee's valid set of extension numbers, and those are in turn
    // validated against the max allowed number, the check is unnecessary for
    // extension fields.
    // This avoids cross-linking issues that arise when attempting to check if
    // the extendee is a message_set_wire_format message, which has a higher max
    // on extension numbers.
    AddError(result->full_name(), proto, DescriptorPool::ErrorCollector::NUMBER,
             strings::Substitute("Field numbers cannot be greater than $0.",
                                 FieldDescriptor::kMaxNumber));
  } else if (result->number() >= FieldDescriptor::kFirstReservedNumber &&
             result->number() <= FieldDescriptor::kLastReservedNumber) {
    AddError(result->full_name(), proto, DescriptorPool::ErrorCollector::NUMBER,
             strings::Substitute(
               "Field numbers $0 through $1 are reserved for the protocol "
               "buffer library implementation.",
               FieldDescriptor::kFirstReservedNumber,
               FieldDescriptor::kLastReservedNumber));
  }

  if (is_extension) {
    if (!proto.has_extendee()) {
      AddError(result->full_name(), proto,
               DescriptorPool::ErrorCollector::EXTENDEE,
               "FieldDescriptorProto.extendee not set for extension field.");
    }

    result->extension_scope_ = parent;
  } else {
    if (proto.has_extendee()) {
      AddError(result->full_name(), proto,
               DescriptorPool::ErrorCollector::EXTENDEE,
               "FieldDescriptorProto.extendee set for non-extension field.");
    }

    result->containing_type_ = parent;
  }

  // Copy options.
  if (!proto.has_options()) {
    result->options_ = NULL;  // Will set to default_instance later.
  } else {
    AllocateOptions(proto.options(), result);
  }

  AddSymbol(result->full_name(), parent, result->name(),
            proto, Symbol(result));
}